

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euarel.cc
# Opt level: O0

string * OB::Euarel::url_encode(string *__return_storage_ptr__,string *str,bool form)

{
  bool bVar1;
  int iVar2;
  char c;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  byte *local_50;
  char *e;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  bool form_local;
  string *str_local;
  string *res;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end2._M_current = (char *)std::__cxx11::string::begin();
  e = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&e), bVar1) {
    local_50 = (byte *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&__end2);
    if ((*local_50 == 0x20) && (form)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"+");
    }
    else {
      iVar2 = isalnum((uint)*local_50);
      if (((iVar2 == 0) && (((*local_50 != 0x2d && (*local_50 != 0x5f)) && (*local_50 != 0x2e)))) &&
         (*local_50 != 0x7e)) {
        hex_encode_abi_cxx11_(&local_90,(Euarel *)(ulong)(uint)(int)(char)*local_50,c);
        std::operator+(&local_70,"%",&local_90);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*local_50);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string url_encode(std::string const& str, bool form)
{
  std::string res;
  res.reserve(str.size());

  for (auto const& e : str)
  {
    if (e == ' ' && form)
    {
      res += "+";
    }
    else if (std::isalnum(static_cast<unsigned char>(e)) ||
      e == '-' || e == '_' || e == '.' || e == '~')
    {
      res += e;
    }
    else
    {
      res += "%" + hex_encode(e);
    }
  }

  return res;
}